

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_5,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  VecAccess<float,_4,_3> local_68;
  Vec2 local_50;
  Vector<float,_3> local_48 [2];
  undefined1 local_30 [8];
  Type in1;
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,5>((MatrixCaseUtils *)&in1,evalCtx,0);
  }
  else {
    getInputValue<0,5>((MatrixCaseUtils *)&in1,evalCtx,0);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,2>((ShaderEvalContext *)local_30,(int)evalCtx);
  }
  else {
    getInputValue<0,2>((MatrixCaseUtils *)local_30,evalCtx,1);
  }
  tcu::operator*((tcu *)&local_50,(Matrix<float,_2,_2> *)&in1,(Vector<float,_2> *)local_30);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_48,&local_50);
  tcu::Vector<float,_4>::xyz(&local_68,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_68,local_48);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)&in1);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}